

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

void __thiscall options::load_args(options *this,int argc,char **argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Alloc_hider __s1;
  int iVar1;
  ostream *poVar2;
  mapped_type *this_01;
  iterator iVar3;
  long lVar4;
  _Rb_tree_header *p_Var5;
  allocator<char> local_d1;
  string key;
  anon_class_8_1_8991fb9c set;
  string val;
  string paramKey;
  string paramVal;
  
  this_00 = &this->opts;
  lVar4 = 1;
  set.this = this;
  do {
    if (argc + -1 <= lVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"threads",(allocator<char> *)&val);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,&key);
      p_Var5 = &(this->opts)._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::string::~string((string *)&key);
      if ((_Rb_tree_header *)iVar3._M_node == p_Var5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"-threads",(allocator<char> *)&paramKey);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&val,"1",(allocator<char> *)&paramVal);
        load_args::anon_class_8_1_8991fb9c::operator()(&set,&key,&val);
        std::__cxx11::string::~string((string *)&val);
        std::__cxx11::string::~string((string *)&key);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"multipv",(allocator<char> *)&val);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,&key);
      std::__cxx11::string::~string((string *)&key);
      if ((_Rb_tree_header *)iVar3._M_node == p_Var5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"-multipv",(allocator<char> *)&paramKey);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&val,"1",(allocator<char> *)&paramVal);
        load_args::anon_class_8_1_8991fb9c::operator()(&set,&key,&val);
        std::__cxx11::string::~string((string *)&val);
        std::__cxx11::string::~string((string *)&key);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"hashsize",(allocator<char> *)&val);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,&key);
      std::__cxx11::string::~string((string *)&key);
      if ((_Rb_tree_header *)iVar3._M_node == p_Var5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&key,"-hashsize",(allocator<char> *)&paramKey);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&val,"1000",(allocator<char> *)&paramVal);
        load_args::anon_class_8_1_8991fb9c::operator()(&set,&key,&val);
        std::__cxx11::string::~string((string *)&val);
        std::__cxx11::string::~string((string *)&key);
      }
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key,argv[lVar4],(allocator<char> *)&val);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&val,argv[lVar4 + 1],(allocator<char> *)&paramKey);
    __s1 = key._M_dataplus;
    iVar1 = strcmp(key._M_dataplus._M_p,"-threads");
    if (iVar1 == 0) {
LAB_00112e6d:
      load_args::anon_class_8_1_8991fb9c::operator()(&set,&key,&val);
    }
    else {
      iVar1 = strcmp(__s1._M_p,"-book");
      if (iVar1 == 0) goto LAB_00112e6d;
      iVar1 = strcmp(__s1._M_p,"-hashsize");
      if (iVar1 == 0) goto LAB_00112e6d;
      iVar1 = strcmp(__s1._M_p,"-tune");
      if (iVar1 == 0) goto LAB_00112e6d;
      iVar1 = strcmp(__s1._M_p,"-bench");
      if (iVar1 == 0) goto LAB_00112e6d;
      iVar1 = strcmp(__s1._M_p,"-param");
      if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&paramKey,argv[lVar4 + 1],(allocator<char> *)&paramVal);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&paramVal,argv[lVar4 + 2],&local_d1);
        poVar2 = std::operator<<((ostream *)&std::cout," .. setting new parameter argument: ");
        poVar2 = std::operator<<(poVar2,(string *)&paramKey);
        poVar2 = std::operator<<(poVar2,"=");
        poVar2 = std::operator<<(poVar2,(string *)&paramVal);
        std::endl<char,std::char_traits<char>>(poVar2);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_00,&paramKey);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_01,&paramVal);
        set_engine_params(this);
        std::__cxx11::string::~string((string *)&paramVal);
        std::__cxx11::string::~string((string *)&paramKey);
      }
    }
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&key);
    lVar4 = lVar4 + 2;
  } while( true );
}

Assistant:

inline void options::load_args(int argc, char* argv[]) {

	//read_param_file(std::string("engine.conf"));

	auto matches = [](std::string& s1, const char* s2) { return strcmp(s1.c_str(), s2) == 0; };
	auto set = [this](const std::string& k, const std::string& v) { this->opts.emplace(k.substr(1), v); };

	for (int j = 1; j < argc - 1; j += 2) {
		std::string key = argv[j]; std::string val = argv[j + 1];
		if (matches(key, "-threads")) set(key, val);
		else if (matches(key, "-book")) set(key, val);
		else if (matches(key, "-hashsize")) set(key, val);
		else if (matches(key, "-tune")) set(key, val);
		else if (matches(key, "-bench")) set(key, val);
		else if (matches(key, "-param"))
		{
			std::string paramKey = argv[j + 1];
			std::string paramVal = argv[j + 2]; 
			std::cout << " .. setting new parameter argument: " << paramKey << "=" << paramVal << std::endl;
			this->opts[paramKey] = paramVal;
			set_engine_params();
		}
	}

	// load defaults
	if (opts.find("threads") == opts.end())
		set(std::string("-threads"), std::string("1"));

	if (opts.find("multipv") == opts.end())
		set(std::string("-multipv"), std::string("1"));

	if (opts.find("hashsize") == opts.end())
		set(std::string("-hashsize"), std::string("1000"));
}